

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O0

uint32_t * FastPForLib::__fastunpack5_8(uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  
  *out = *in & 0x1f;
  out[1] = *in >> 5 & 0x1f;
  out[2] = *in >> 10 & 0x1f;
  out[3] = *in >> 0xf & 0x1f;
  out[4] = *in >> 0x14 & 0x1f;
  out[5] = *in >> 0x19 & 0x1f;
  puVar1 = out + 6;
  *puVar1 = *in >> 0x1e;
  *puVar1 = (in[1] & 7) << 2 | *puVar1;
  out[7] = in[1] >> 3 & 0x1f;
  return in + 2;
}

Assistant:

const uint32_t *__fastunpack5_8(const uint32_t *__restrict__ in,
                                uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 5);
  out++;
  *out = ((*in) >> 5) % (1U << 5);
  out++;
  *out = ((*in) >> 10) % (1U << 5);
  out++;
  *out = ((*in) >> 15) % (1U << 5);
  out++;
  *out = ((*in) >> 20) % (1U << 5);
  out++;
  *out = ((*in) >> 25) % (1U << 5);
  out++;
  *out = ((*in) >> 30);
  ++in;
  *out |= ((*in) % (1U << 3)) << (5 - 3);
  out++;
  *out = ((*in) >> 3) % (1U << 5);
  out++;

  return in + 1;
}